

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::ParseGoogleTestFlagsOnlyImpl<wchar_t>(int *argc,wchar_t **argv)

{
  bool bVar1;
  char *str;
  wchar_t **in_RDX;
  wchar_t **extraout_RDX;
  int local_58;
  int j;
  char *arg;
  string arg_string;
  int i;
  wchar_t **argv_local;
  int *argc_local;
  
  for (arg_string.field_2._12_4_ = 1; (int)arg_string.field_2._12_4_ < *argc;
      arg_string.field_2._12_4_ = arg_string.field_2._12_4_ + 1) {
    StreamableToString<wchar_t*>
              ((string *)&arg,(internal *)(argv + (int)arg_string.field_2._12_4_),in_RDX);
    str = (char *)std::__cxx11::string::c_str();
    bVar1 = ParseBoolFlag(str,"also_run_disabled_tests",(bool *)&FLAGS_gtest_also_run_disabled_tests
                         );
    if (((((bVar1) ||
          (bVar1 = ParseBoolFlag(str,"break_on_failure",(bool *)&FLAGS_gtest_break_on_failure),
          bVar1)) ||
         (bVar1 = ParseBoolFlag(str,"catch_exceptions",(bool *)&FLAGS_gtest_catch_exceptions), bVar1
         )) || (((bVar1 = ParseStringFlag(str,"color",(string *)FLAGS_gtest_color_abi_cxx11_), bVar1
                 || (bVar1 = ParseStringFlag(str,"death_test_style",
                                             (string *)FLAGS_gtest_death_test_style_abi_cxx11_),
                    bVar1)) ||
                ((bVar1 = ParseBoolFlag(str,"death_test_use_fork",
                                        (bool *)&FLAGS_gtest_death_test_use_fork), bVar1 ||
                 ((bVar1 = ParseStringFlag(str,"filter",(string *)FLAGS_gtest_filter_abi_cxx11_),
                  bVar1 || (bVar1 = ParseStringFlag(str,"internal_run_death_test",
                                                    (string *)
                                                    FLAGS_gtest_internal_run_death_test_abi_cxx11_),
                           bVar1)))))))) ||
       ((bVar1 = ParseBoolFlag(str,"list_tests",(bool *)&FLAGS_gtest_list_tests), bVar1 ||
        (((((bVar1 = ParseStringFlag(str,"output",(string *)FLAGS_gtest_output_abi_cxx11_), bVar1 ||
            (bVar1 = ParseBoolFlag(str,"print_time",(bool *)&FLAGS_gtest_print_time), bVar1)) ||
           (bVar1 = ParseInt32Flag(str,"random_seed",&FLAGS_gtest_random_seed), bVar1)) ||
          ((bVar1 = ParseInt32Flag(str,"repeat",&FLAGS_gtest_repeat), bVar1 ||
           (bVar1 = ParseBoolFlag(str,"shuffle",(bool *)&FLAGS_gtest_shuffle), bVar1)))) ||
         ((bVar1 = ParseInt32Flag(str,"stack_trace_depth",&FLAGS_gtest_stack_trace_depth), bVar1 ||
          ((bVar1 = ParseStringFlag(str,"stream_result_to",
                                    (string *)FLAGS_gtest_stream_result_to_abi_cxx11_), bVar1 ||
           (bVar1 = ParseBoolFlag(str,"throw_on_failure",(bool *)&FLAGS_gtest_throw_on_failure),
           bVar1)))))))))) {
      for (local_58 = arg_string.field_2._12_4_; local_58 != *argc; local_58 = local_58 + 1) {
        argv[local_58] = argv[local_58 + 1];
      }
      *argc = *argc + -1;
      arg_string.field_2._12_4_ = arg_string.field_2._12_4_ + -1;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &arg,"--help");
      if ((((bVar1) ||
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&arg,"-h"), bVar1)) ||
          (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&arg,"-?"), bVar1)) ||
         ((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&arg,"/?"), bVar1 ||
          (bVar1 = HasGoogleTestFlagPrefix(str), bVar1)))) {
        g_help_flag = 1;
      }
    }
    std::__cxx11::string::~string((string *)&arg);
    in_RDX = extraout_RDX;
  }
  if ((g_help_flag & 1) != 0) {
    PrintColorEncoded(
                     "This program contains tests written using Google Test. You can use the\nfollowing command line flags to control its behavior:\n\nTest Selection:\n  @G--gtest_list_tests@D\n      List the names of all tests instead of running them. The name of\n      TEST(Foo, Bar) is \"Foo.Bar\".\n  @G--gtest_filter=@YPOSTIVE_PATTERNS[@G-@YNEGATIVE_PATTERNS]@D\n      Run only the tests whose name matches one of the positive patterns but\n      none of the negative patterns. \'?\' matches any single character; \'*\'\n      matches any substring; \':\' separates two patterns.\n  @G--gtest_also_run_disabled_tests@D\n      Run all disabled tests too.\n\nTest Execution:\n  @G--gtest_repeat=@Y[COUNT]@D\n      Run the tests repeatedly; use a negative count to repeat forever.\n  @G--gtest_shuffle@D\n      Randomize tests\' orders on every iteration.\n  @G--gtest_random_seed=@Y[NUMBER]@D\n      Random number seed to use for shuffling test orders (between 1 and\n      99999, or 0 to use a seed based on the current time).\n\nTest Output:\n  @G--gtest_color=@Y(@Gyes@Y|@Gno@Y|@Gauto@Y)@D\n      Enable/disable colored output. The default is @Gauto@D.\n  -@G-gtest_print_time=0@D\n      Don\'t print the elapsed time of each test.\n  @G--gtest_output=xml@Y[@G:@YDIRECTORY_PATH@G/@Y|@G:@YFILE_PATH]@D\n      Generate an XML report in the given directory or with the given file\n      name. @YFILE_PATH@D defaults to @Gtest_details.xml@D.\n  @G--gtest_stream_result_to=@YHOST@G:@YPORT@D\n      Stream test results to the given server.\n\nAssertion Behavior:\n  @G--gtest_death_test_style=@Y(@Gfast@Y|@Gthreadsafe@Y)@D\n      Set the default death test style.\n  @G--gtest_break_on_failure@D\n      Turn assertion failures into debugger break-points.\n  @G--gtest_throw_on_failure@D\n      Turn assertion failures into C++ exceptions.\n  @G--gtest_catch_exceptions=0@D\n      Do not report exceptions as test failures. Instead, allow them\n      to crash the program or throw a pop-up (on Windows).\n\nExcept for @G--gtest_list_tests@D, you can alternatively set the corresponding\nenvironment variable of a flag (all let..." /* TRUNCATED STRING LITERAL */
                     );
  }
  return;
}

Assistant:

void ParseGoogleTestFlagsOnlyImpl(int* argc, CharType** argv) {
  for (int i = 1; i < *argc; i++) {
    const std::string arg_string = StreamableToString(argv[i]);
    const char* const arg = arg_string.c_str();

    using internal::ParseBoolFlag;
    using internal::ParseInt32Flag;
    using internal::ParseStringFlag;

    // Do we see a Google Test flag?
    if (ParseBoolFlag(arg, kAlsoRunDisabledTestsFlag,
                      &GTEST_FLAG(also_run_disabled_tests)) ||
        ParseBoolFlag(arg, kBreakOnFailureFlag,
                      &GTEST_FLAG(break_on_failure)) ||
        ParseBoolFlag(arg, kCatchExceptionsFlag,
                      &GTEST_FLAG(catch_exceptions)) ||
        ParseStringFlag(arg, kColorFlag, &GTEST_FLAG(color)) ||
        ParseStringFlag(arg, kDeathTestStyleFlag,
                        &GTEST_FLAG(death_test_style)) ||
        ParseBoolFlag(arg, kDeathTestUseFork,
                      &GTEST_FLAG(death_test_use_fork)) ||
        ParseStringFlag(arg, kFilterFlag, &GTEST_FLAG(filter)) ||
        ParseStringFlag(arg, kInternalRunDeathTestFlag,
                        &GTEST_FLAG(internal_run_death_test)) ||
        ParseBoolFlag(arg, kListTestsFlag, &GTEST_FLAG(list_tests)) ||
        ParseStringFlag(arg, kOutputFlag, &GTEST_FLAG(output)) ||
        ParseBoolFlag(arg, kPrintTimeFlag, &GTEST_FLAG(print_time)) ||
        ParseInt32Flag(arg, kRandomSeedFlag, &GTEST_FLAG(random_seed)) ||
        ParseInt32Flag(arg, kRepeatFlag, &GTEST_FLAG(repeat)) ||
        ParseBoolFlag(arg, kShuffleFlag, &GTEST_FLAG(shuffle)) ||
        ParseInt32Flag(arg, kStackTraceDepthFlag,
                       &GTEST_FLAG(stack_trace_depth)) ||
        ParseStringFlag(arg, kStreamResultToFlag,
                        &GTEST_FLAG(stream_result_to)) ||
        ParseBoolFlag(arg, kThrowOnFailureFlag,
                      &GTEST_FLAG(throw_on_failure))
        ) {
      // Yes.  Shift the remainder of the argv list left by one.  Note
      // that argv has (*argc + 1) elements, the last one always being
      // NULL.  The following loop moves the trailing NULL element as
      // well.
      for (int j = i; j != *argc; j++) {
        argv[j] = argv[j + 1];
      }

      // Decrements the argument count.
      (*argc)--;

      // We also need to decrement the iterator as we just removed
      // an element.
      i--;
    } else if (arg_string == "--help" || arg_string == "-h" ||
               arg_string == "-?" || arg_string == "/?" ||
               HasGoogleTestFlagPrefix(arg)) {
      // Both help flag and unrecognized Google Test flags (excluding
      // internal ones) trigger help display.
      g_help_flag = true;
    }
  }

  if (g_help_flag) {
    // We print the help here instead of in RUN_ALL_TESTS(), as the
    // latter may not be called at all if the user is using Google
    // Test with another testing framework.
    PrintColorEncoded(kColorEncodedHelpMessage);
  }
}